

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

string * __thiscall
tcu::FloatFormat::floatToHex_abi_cxx11_(string *__return_storage_ptr__,FloatFormat *this,double x)

{
  _Setfill<char> _Var1;
  deBool dVar2;
  int iVar3;
  int exponent_00;
  int iVar4;
  int iVar5;
  _Setw _Var6;
  ulong uVar7;
  ostream *poVar8;
  char *pcVar9;
  double dVar10;
  char *local_248;
  ostringstream local_210 [8];
  ostringstream oss;
  deUint64 aligned;
  int numDigits;
  int exponent;
  deUint64 fraction;
  deUint64 whole;
  deUint64 bits;
  int shift;
  double frac;
  int exp;
  allocator<char> local_21;
  double local_20;
  double x_local;
  FloatFormat *this_local;
  
  local_20 = x;
  x_local = (double)this;
  this_local = (FloatFormat *)__return_storage_ptr__;
  dVar2 = deIsNaN(x);
  if (dVar2 == 0) {
    iVar3 = deIsInf(local_20);
    if (iVar3 == 0) {
      if ((local_20 != 0.0) || (NAN(local_20))) {
        frac._0_4_ = 0;
        dVar10 = deAbs(local_20);
        dVar10 = deFractExp(dVar10,(int *)&frac);
        exponent_00 = exponentShift(this,frac._0_4_);
        dVar10 = deLdExp(dVar10,exponent_00);
        uVar7 = (long)dVar10 | (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f;
        iVar3 = this->m_fractionBits;
        iVar4 = frac._0_4_ + this->m_fractionBits;
        iVar5 = this->m_fractionBits + 3;
        if (iVar5 < 0) {
          iVar5 = this->m_fractionBits + 6;
        }
        oss._368_8_ = (uVar7 & (1L << ((byte)this->m_fractionBits & 0x3f)) - 1U) <<
                      ((char)((iVar5 >> 2) << 2) - (char)this->m_fractionBits & 0x3fU);
        std::__cxx11::ostringstream::ostringstream(local_210);
        pcVar9 = "";
        if (local_20 < 0.0) {
          pcVar9 = "-";
        }
        poVar8 = std::operator<<((ostream *)local_210,pcVar9);
        poVar8 = std::operator<<(poVar8,"0x");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar7 >> ((byte)iVar3 & 0x3f));
        poVar8 = std::operator<<(poVar8,".");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::hex);
        _Var6 = std::setw(iVar5 >> 2);
        poVar8 = std::operator<<(poVar8,_Var6);
        _Var1 = std::setfill<char>('0');
        poVar8 = std::operator<<(poVar8,_Var1._M_c);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,oss._368_8_);
        poVar8 = std::operator<<(poVar8,"p");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::dec);
        _Var6 = std::setw(0);
        poVar8 = std::operator<<(poVar8,_Var6);
        std::ostream::operator<<(poVar8,iVar4 - exponent_00);
        std::__cxx11::ostringstream::str();
        std::__cxx11::ostringstream::~ostringstream(local_210);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"0.0",(allocator<char> *)((long)&frac + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&frac + 6));
      }
    }
    else {
      if (0.0 <= local_20) {
        local_248 = "+";
      }
      else {
        local_248 = "-";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&exp,"inf",(allocator<char> *)((long)&frac + 7));
      std::operator+(__return_storage_ptr__,local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exp);
      std::__cxx11::string::~string((string *)&exp);
      std::allocator<char>::~allocator((allocator<char> *)((long)&frac + 7));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NaN",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string	FloatFormat::floatToHex	(double x) const
{
	if (deIsNaN(x))
		return "NaN";
	else if (deIsInf(x))
		return (x < 0.0 ? "-" : "+") + std::string("inf");
	else if (x == 0.0) // \todo [2014-03-27 lauri] Negative zero
		return "0.0";

	int					exp			= 0;
	const double		frac		= deFractExp(deAbs(x), &exp);
	const int			shift		= exponentShift(exp);
	const deUint64		bits		= deUint64(deLdExp(frac, shift));
	const deUint64		whole		= bits >> m_fractionBits;
	const deUint64		fraction	= bits & ((deUint64(1) << m_fractionBits) - 1);
	const int			exponent	= exp + m_fractionBits - shift;
	const int			numDigits	= (m_fractionBits + 3) / 4;
	const deUint64		aligned		= fraction << (numDigits * 4 - m_fractionBits);
	std::ostringstream	oss;

	oss << (x < 0 ? "-" : "")
		<< "0x" << whole << "."
		<< std::hex << std::setw(numDigits) << std::setfill('0') << aligned
		<< "p" << std::dec << std::setw(0) << exponent;

	return oss.str();
}